

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O2

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile
          (ClassFactoredSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  istream *piVar6;
  ulong *puVar7;
  long lVar8;
  pointer piVar9;
  pointer pvVar10;
  int iVar11;
  long lVar12;
  char *__assertion;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  reference rVar17;
  uint word;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_298;
  vector<int,_std::allocator<int>_> *local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_288;
  Dict *local_280;
  string line;
  string local_258;
  ifstream in;
  byte abStack_218 [488];
  
  local_280 = word_dict;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Reading clusters from ");
  poVar5 = std::operator<<(poVar5,(string *)cluster_file);
  std::operator<<(poVar5," ...\n");
  std::ifstream::ifstream(&in,(string *)cluster_file,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    __assertion = "in";
    uVar3 = 0x61;
LAB_0023188e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,uVar3,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  iVar16 = 0;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_290 = &this->widx2cidx;
  local_288 = &this->widx2cwidx;
  local_298 = &this->cidx2words;
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      iVar11 = 0;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&this->singleton_cluster,
                 ((long)(this->cidx2words).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cidx2words).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,false);
      uVar3 = 0;
      while( true ) {
        pvVar10 = (this->cidx2words).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (ulong)uVar3;
        if ((ulong)(((long)(this->cidx2words).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10) / 0x18) <=
            uVar14) break;
        uVar15 = (long)*(pointer *)
                        ((long)&pvVar10[uVar14].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar10[uVar14].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data;
        iVar11 = iVar11 + (uint)(uVar15 < 5);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->singleton_cluster,uVar14);
        puVar7 = rVar17._M_p;
        if (uVar15 < 5) {
          uVar14 = rVar17._M_mask | *puVar7;
        }
        else {
          uVar14 = ~rVar17._M_mask & *puVar7;
        }
        *puVar7 = uVar14;
        uVar3 = uVar3 + 1;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Read ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar16);
      poVar5 = std::operator<<(poVar5," words in ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," clusters (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar11);
      std::operator<<(poVar5," singleton clusters)\n");
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&in);
      return;
    }
    uVar15 = line._M_string_length & 0xffffffff;
    lVar8 = 1;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      lVar12 = lVar8;
      uVar14 = uVar13 + 1;
      if (uVar15 <= uVar13) break;
      lVar8 = lVar12 + 1;
    } while (line._M_dataplus._M_p[uVar13] == ' ' || line._M_dataplus._M_p[uVar13] == '\t');
    iVar16 = iVar16 + 1;
    for (lVar8 = -1;
        ((uVar1 = uVar14 + lVar8, uVar2 = uVar1, uVar1 < uVar15 &&
         (line._M_dataplus._M_p[lVar8 + uVar14] != ' ')) &&
        (line._M_dataplus._M_p[lVar8 + uVar14] != '\t')); lVar8 = lVar8 + 1) {
      lVar12 = lVar12 + 1;
    }
    do {
      uVar14 = uVar2;
      lVar12 = lVar12 + 1;
      if (uVar15 <= uVar14) break;
      uVar2 = uVar14 + 1;
    } while (line._M_dataplus._M_p[uVar14] == ' ' || line._M_dataplus._M_p[uVar14] == '\t');
    for (lVar8 = -2;
        (((ulong)(lVar12 + lVar8) < uVar15 && (line._M_dataplus._M_p[lVar8 + lVar12] != '\t')) &&
        (line._M_dataplus._M_p[lVar8 + lVar12] != ' ')); lVar8 = lVar8 + 1) {
    }
    if (uVar1 <= uVar13) {
      __assertion = "endc > startc";
      uVar3 = 0x6f;
      goto LAB_0023188e;
    }
    if (uVar14 <= uVar1) {
      __assertion = "startw > endc";
      uVar3 = 0x70;
      goto LAB_0023188e;
    }
    if ((ulong)(lVar12 + lVar8) <= uVar14) {
      __assertion = "endw > startw";
      uVar3 = 0x71;
      goto LAB_0023188e;
    }
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&line);
    uVar3 = Dict::Convert(&this->cdict,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&line);
    uVar4 = Dict::Convert(local_280,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    uVar14 = (ulong)uVar4;
    piVar9 = (this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    word = uVar4;
    if ((ulong)((long)(this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar9 >> 2) <= uVar14) {
      local_258._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (local_290,(ulong)(uVar4 + 1),(value_type_conflict1 *)&local_258);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(local_288,(ulong)(word + 1));
      uVar14 = (ulong)word;
      piVar9 = (local_290->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar9[uVar14] = uVar3;
    uVar14 = (ulong)uVar3;
    pvVar10 = (this->cidx2words).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->cidx2words).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10) / 0x18) <= uVar14
       ) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(local_298,(ulong)(uVar3 + 1));
      pvVar10 = (local_298->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    (local_288->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start[word] =
         (uint)((ulong)((long)*(pointer *)
                               ((long)&pvVar10[uVar14].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar10[uVar14].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data) >> 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar10 + uVar14,&word);
  } while( true );
}

Assistant:

void ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  while(getline(in, line)) {
    ++wc;
    const unsigned len = line.size();
    unsigned startc = 0;
    while (is_ws(line[startc]) && startc < len) { ++startc; }
    unsigned endc = startc;
    while (not_ws(line[endc]) && endc < len) { ++endc; }
    unsigned startw = endc;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endc > startc);
    assert(startw > endc);
    assert(endw > startw);
    unsigned c = cdict.Convert(line.substr(startc, endc - startc));
    unsigned word = word_dict->Convert(line.substr(startw, endw - startw));
    if (word >= widx2cidx.size()) {
      widx2cidx.resize(word + 1, -1);
      widx2cwidx.resize(word + 1);
    }
    widx2cidx[word] = c;
    if (c >= cidx2words.size()) cidx2words.resize(c + 1);
    auto& clusterwords = cidx2words[c];
    widx2cwidx[word] = clusterwords.size();
    clusterwords.push_back(word);
  }
  singleton_cluster.resize(cidx2words.size());
  int scs = 0;
  for (unsigned i = 0; i < cidx2words.size(); ++i) {
    bool sc = cidx2words[i].size() <= 1;
    if (sc) scs++;
    singleton_cluster[i] = sc;
  }
  cerr << "Read " << wc << " words in " << cdict.size() << " clusters (" << scs << " singleton clusters)\n";
}